

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

void VP8LOptimizeSampling
               (uint32_t *image,int full_width,int full_height,int bits,int max_bits,
               int *best_bits_out)

{
  long lVar1;
  uint32_t *puVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t *puVar19;
  ulong uVar20;
  ulong uVar21;
  uint32_t *puVar22;
  long lVar23;
  uint uVar24;
  
  bVar10 = (byte)bits;
  iVar4 = 1 << (bVar10 & 0x1f);
  uVar24 = (iVar4 + full_width) - 1U >> (bVar10 & 0x1f);
  *best_bits_out = bits;
  lVar23 = (long)(int)uVar24;
  __n = lVar23 * 4;
  lVar8 = (long)(int)((iVar4 + full_height) - 1U >> (bVar10 & 0x1f));
  iVar4 = bits;
  iVar6 = bits;
  if (bits < max_bits) {
    iVar6 = max_bits;
  }
  while (iVar11 = iVar4, iVar4 = iVar6, iVar11 < max_bits) {
    lVar12 = (long)(1 << ((char)(iVar11 + 1) - bVar10 & 0x1f));
    lVar13 = (long)(1 << ((char)iVar11 - bVar10 & 0x1f));
    lVar14 = lVar13 - lVar12;
    puVar19 = image;
    while( true ) {
      lVar14 = lVar14 + lVar12;
      iVar4 = iVar11 + 1;
      if (lVar8 <= lVar14) break;
      iVar5 = bcmp(puVar19,(uint32_t *)((long)puVar19 + __n * lVar13),__n);
      puVar19 = (uint32_t *)((long)puVar19 + __n * lVar12);
      iVar4 = iVar11;
      if (iVar5 != 0) goto LAB_0016b439;
    }
  }
LAB_0016b439:
  if (iVar4 != bits) {
    iVar6 = bits;
    if (iVar4 < bits) {
      iVar6 = iVar4;
    }
    do {
      iVar11 = iVar6;
      if (iVar4 - bits == 0 || iVar4 < bits) break;
      lVar12 = (long)(1 << ((byte)(iVar4 - bits) & 0x1f));
      bVar3 = true;
      puVar19 = image;
      for (lVar13 = 0; (bVar3 && (lVar13 < lVar8)); lVar13 = lVar13 + 1) {
        bVar3 = true;
        lVar14 = 0;
        puVar22 = puVar19;
        while ((bVar3 && (lVar14 < lVar23))) {
          lVar1 = lVar14 + lVar12;
          uVar17 = (uint)lVar1;
          uVar7 = uVar24;
          if ((int)uVar17 < (int)uVar24) {
            uVar7 = uVar17;
          }
          lVar16 = 1;
          do {
            if ((long)(int)uVar7 <= lVar14 + lVar16) {
              bVar3 = true;
              goto LAB_0016b4d8;
            }
            puVar2 = puVar22 + lVar16;
            lVar16 = lVar16 + 1;
          } while (*puVar2 == image[lVar13 * lVar23 + lVar14]);
          bVar3 = false;
LAB_0016b4d8:
          puVar22 = puVar22 + lVar12;
          lVar14 = lVar1;
        }
        puVar19 = puVar19 + lVar23;
      }
      iVar11 = iVar4;
      iVar4 = iVar4 + -1;
    } while (!bVar3);
    if (iVar11 - bits != 0) {
      bVar10 = (byte)iVar11;
      iVar4 = 1 << (bVar10 & 0x1f);
      uVar7 = (uint)(full_width + -1 + iVar4) >> (bVar10 & 0x1f);
      uVar17 = iVar4 + full_height + -1;
      uVar20 = 0;
      uVar21 = 0;
      if (0 < (int)uVar7) {
        uVar21 = (ulong)uVar7;
      }
      uVar18 = (ulong)(uVar17 >> (bVar10 & 0x1f));
      if ((int)(uVar17 >> (bVar10 & 0x1f)) < 1) {
        uVar18 = uVar20;
      }
      puVar19 = image;
      for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
        for (uVar9 = 0; uVar21 != uVar9; uVar9 = uVar9 + 1) {
          puVar19[uVar9] = image[(int)uVar20 + (int)uVar9 << ((byte)(iVar11 - bits) & 0x1f)];
        }
        puVar19 = puVar19 + (int)uVar7;
        uVar20 = uVar20 + uVar24;
      }
      *best_bits_out = iVar11;
    }
  }
  return;
}

Assistant:

void VP8LOptimizeSampling(uint32_t* const image, int full_width,
                          int full_height, int bits, int max_bits,
                          int* best_bits_out) {
  int width = VP8LSubSampleSize(full_width, bits);
  int height = VP8LSubSampleSize(full_height, bits);
  int old_width, x, y, square_size;
  int best_bits = bits;
  *best_bits_out = bits;
  // Check rows first.
  while (best_bits < max_bits) {
    const int new_square_size = 1 << (best_bits + 1 - bits);
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; y + square_size < height; y += new_square_size) {
      // Check the first lines of consecutive line groups.
      if (memcmp(&image[y * width], &image[(y + square_size) * width],
                 width * sizeof(*image)) != 0) {
        is_good = 0;
        break;
      }
    }
    if (is_good) {
      ++best_bits;
    } else {
      break;
    }
  }
  if (best_bits == bits) return;

  // Check columns.
  while (best_bits > bits) {
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; is_good && y < height; ++y) {
      for (x = 0; is_good && x < width; x += square_size) {
        int i;
        for (i = x + 1; i < GetMin(x + square_size, width); ++i) {
          if (image[y * width + i] != image[y * width + x]) {
            is_good = 0;
            break;
          }
        }
      }
    }
    if (is_good) {
      break;
    }
    --best_bits;
  }
  if (best_bits == bits) return;

  // Subsample the image.
  old_width = width;
  square_size = 1 << (best_bits - bits);
  width = VP8LSubSampleSize(full_width, best_bits);
  height = VP8LSubSampleSize(full_height, best_bits);
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      image[y * width + x] = image[square_size * (y * old_width + x)];
    }
  }
  *best_bits_out = best_bits;
}